

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O0

void Hacl_Hash_Blake2s_Simd128_store_state128s_to_state32
               (uint32_t *st32,Lib_IntVector_Intrinsics_vec128 *st)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  __uint32_t _Var4;
  uint32_t x_15;
  uint32_t r_15;
  uint32_t u_15;
  uint8_t *bj_15;
  uint32_t *os_15;
  uint32_t x_14;
  uint32_t r_14;
  uint32_t u_14;
  uint8_t *bj_14;
  uint32_t *os_14;
  uint32_t x_13;
  uint32_t r_13;
  uint32_t u_13;
  uint8_t *bj_13;
  uint32_t *os_13;
  uint32_t x_12;
  uint32_t r_12;
  uint32_t u_12;
  uint8_t *bj_12;
  uint32_t *os_12;
  longlong lStack_2c8;
  uint32_t i_3;
  uint8_t b82 [16];
  uint32_t x_11;
  uint32_t r_11;
  uint32_t u_11;
  uint8_t *bj_11;
  uint32_t *os_11;
  uint32_t x_10;
  uint32_t r_10;
  uint32_t u_10;
  uint8_t *bj_10;
  uint32_t *os_10;
  uint32_t x_9;
  uint32_t r_9;
  uint32_t u_9;
  uint8_t *bj_9;
  uint32_t *os_9;
  uint32_t x_8;
  uint32_t r_8;
  uint32_t u_8;
  uint8_t *bj_8;
  uint32_t *os_8;
  longlong lStack_228;
  uint32_t i_2;
  uint8_t b81 [16];
  uint32_t x_7;
  uint32_t r_7;
  uint32_t u_7;
  uint8_t *bj_7;
  uint32_t *os_7;
  uint32_t x_6;
  uint32_t r_6;
  uint32_t u_6;
  uint8_t *bj_6;
  uint32_t *os_6;
  uint32_t x_5;
  uint32_t r_5;
  uint32_t u_5;
  uint8_t *bj_5;
  uint32_t *os_5;
  uint32_t x_4;
  uint32_t r_4;
  uint32_t u_4;
  uint8_t *bj_4;
  uint32_t *os_4;
  longlong lStack_188;
  uint32_t i_1;
  uint8_t b80 [16];
  uint32_t x_3;
  uint32_t r_3;
  uint32_t u_3;
  uint8_t *bj_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t r_2;
  uint32_t u_2;
  uint8_t *bj_2;
  uint32_t *os_2;
  uint32_t x_1;
  uint32_t r_1;
  uint32_t u_1;
  uint8_t *bj_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t r;
  uint32_t u;
  uint8_t *bj;
  uint32_t *os;
  longlong lStack_e8;
  uint32_t i;
  uint8_t b8 [16];
  uint32_t *b3;
  uint32_t *b2;
  uint32_t *b1;
  uint32_t *b0;
  Lib_IntVector_Intrinsics_vec128 *r3;
  Lib_IntVector_Intrinsics_vec128 *r2;
  Lib_IntVector_Intrinsics_vec128 *r1;
  Lib_IntVector_Intrinsics_vec128 *r0;
  Lib_IntVector_Intrinsics_vec128 *st_local;
  uint32_t *st32_local;
  
  b8._8_8_ = st32 + 0xc;
  memset(&stack0xffffffffffffff18,0,0x10);
  lStack_e8 = (*st)[0];
  b8._0_8_ = (*st)[1];
  uVar3 = load32((uint8_t *)&stack0xffffffffffffff18);
  _Var4 = __uint32_identity(uVar3);
  *st32 = _Var4;
  uVar3 = load32((uint8_t *)&i);
  _Var4 = __uint32_identity(uVar3);
  st32[1] = _Var4;
  uVar3 = load32(b8);
  _Var4 = __uint32_identity(uVar3);
  st32[2] = _Var4;
  uVar3 = load32(b8 + 4);
  _Var4 = __uint32_identity(uVar3);
  st32[3] = _Var4;
  memset(&stack0xfffffffffffffe78,0,0x10);
  lStack_188 = st[1][0];
  b80._0_8_ = st[1][1];
  uVar3 = load32((uint8_t *)&stack0xfffffffffffffe78);
  _Var4 = __uint32_identity(uVar3);
  st32[4] = _Var4;
  uVar3 = load32((uint8_t *)&i_1);
  _Var4 = __uint32_identity(uVar3);
  st32[5] = _Var4;
  uVar3 = load32(b80);
  _Var4 = __uint32_identity(uVar3);
  st32[6] = _Var4;
  uVar3 = load32(b80 + 4);
  _Var4 = __uint32_identity(uVar3);
  st32[7] = _Var4;
  memset(&stack0xfffffffffffffdd8,0,0x10);
  lStack_228 = st[2][0];
  b81._0_8_ = st[2][1];
  uVar3 = load32((uint8_t *)&stack0xfffffffffffffdd8);
  _Var4 = __uint32_identity(uVar3);
  st32[8] = _Var4;
  uVar3 = load32((uint8_t *)&i_2);
  _Var4 = __uint32_identity(uVar3);
  st32[9] = _Var4;
  uVar3 = load32(b81);
  _Var4 = __uint32_identity(uVar3);
  st32[10] = _Var4;
  uVar3 = load32(b81 + 4);
  _Var4 = __uint32_identity(uVar3);
  st32[0xb] = _Var4;
  memset(&stack0xfffffffffffffd38,0,0x10);
  uVar1 = b8._8_8_;
  lStack_2c8 = st[3][0];
  b82._0_8_ = st[3][1];
  uVar3 = load32((uint8_t *)&stack0xfffffffffffffd38);
  _Var4 = __uint32_identity(uVar3);
  uVar2 = b8._8_8_;
  *(__uint32_t *)uVar1 = _Var4;
  uVar3 = load32((uint8_t *)&i_3);
  _Var4 = __uint32_identity(uVar3);
  uVar1 = b8._8_8_;
  *(__uint32_t *)(uVar2 + 4) = _Var4;
  uVar3 = load32(b82);
  _Var4 = __uint32_identity(uVar3);
  uVar2 = b8._8_8_;
  *(__uint32_t *)(uVar1 + 8) = _Var4;
  uVar3 = load32(b82 + 4);
  _Var4 = __uint32_identity(uVar3);
  *(__uint32_t *)(uVar2 + 0xc) = _Var4;
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_Simd128_store_state128s_to_state32(
  uint32_t *st32,
  Lib_IntVector_Intrinsics_vec128 *st
)
{
  Lib_IntVector_Intrinsics_vec128 *r0 = st;
  Lib_IntVector_Intrinsics_vec128 *r1 = st + 1U;
  Lib_IntVector_Intrinsics_vec128 *r2 = st + 2U;
  Lib_IntVector_Intrinsics_vec128 *r3 = st + 3U;
  uint32_t *b0 = st32;
  uint32_t *b1 = st32 + 4U;
  uint32_t *b2 = st32 + 8U;
  uint32_t *b3 = st32 + 12U;
  uint8_t b8[16U] = { 0U };
  Lib_IntVector_Intrinsics_vec128_store32_le(b8, r0[0U]);
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = b0;
    uint8_t *bj = b8 + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  uint8_t b80[16U] = { 0U };
  Lib_IntVector_Intrinsics_vec128_store32_le(b80, r1[0U]);
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = b1;
    uint8_t *bj = b80 + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  uint8_t b81[16U] = { 0U };
  Lib_IntVector_Intrinsics_vec128_store32_le(b81, r2[0U]);
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = b2;
    uint8_t *bj = b81 + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  uint8_t b82[16U] = { 0U };
  Lib_IntVector_Intrinsics_vec128_store32_le(b82, r3[0U]);
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = b3;
    uint8_t *bj = b82 + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
}